

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODRowReader.h
# Opt level: O2

int ZXing::OneD::RowReader::
    DecodeDigit<ZXing::PatternView,std::array<ZXing::FixedPattern<5,15,false>,6ul>>
              (PatternView *counters,array<ZXing::FixedPattern<5,_15,_false>,_6UL> *patterns,
              float maxAvgVariance,float maxIndividualVariance,bool requireUnambiguousMatch)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  float fVar4;
  float fVar5;
  
  iVar2 = -1;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    fVar4 = PatternMatchVariance<ZXing::PatternView,ZXing::FixedPattern<5,15,false>>
                      (counters,patterns->_M_elems,maxIndividualVariance);
    iVar1 = (int)lVar3;
    if (maxAvgVariance <= fVar4) {
      iVar1 = iVar2;
    }
    fVar5 = maxAvgVariance;
    if (fVar4 < maxAvgVariance || !requireUnambiguousMatch) {
      fVar5 = fVar4;
      iVar2 = iVar1;
      if (maxAvgVariance <= fVar4) {
        fVar5 = maxAvgVariance;
      }
    }
    else if ((fVar4 == maxAvgVariance) && (!NAN(fVar4) && !NAN(maxAvgVariance))) {
      iVar2 = -1;
    }
    patterns = (array<ZXing::FixedPattern<5,_15,_false>,_6UL> *)((long)patterns + 10);
    maxAvgVariance = fVar5;
  }
  return iVar2;
}

Assistant:

static int DecodeDigit(const Counters& counters, const Patterns& patterns, float maxAvgVariance,
						   float maxIndividualVariance, bool requireUnambiguousMatch = true)
	{
		float bestVariance = maxAvgVariance; // worst variance we'll accept
		constexpr int INVALID_MATCH = -1;
		int bestMatch = INVALID_MATCH;
		for (int i = 0; i < Size(patterns); i++) {
			float variance = PatternMatchVariance(counters, patterns[i], maxIndividualVariance);
			if (variance < bestVariance) {
				bestVariance = variance;
				bestMatch = i;
			} else if (requireUnambiguousMatch && variance == bestVariance) {
				// if we find a second 'best match' with the same variance, we can not reliably report to have a suitable match
				bestMatch = INVALID_MATCH;
			}
		}
		return bestMatch;
	}